

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::AllocateInlineCache(FunctionBody *this)

{
  ThreadContext *this_00;
  Type pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  PropertyId PVar6;
  undefined4 *puVar7;
  Recycler *pRVar8;
  void **ptr;
  uchar *puVar9;
  void *pvVar10;
  RootObjectBase *this_01;
  PropertyRecord *pPVar11;
  InlineCache *pIVar12;
  ulong count;
  ulong uVar13;
  ulong uVar14;
  void **ppvVar15;
  undefined1 local_88 [8];
  TrackAllocData data;
  
  if ((this->inlineCaches).ptr != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1883,"(this->inlineCaches == nullptr)",
                                "this->inlineCaches == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  uVar4 = GetInlineCacheCount(this);
  uVar5 = GetIsInstInlineCacheCount(this);
  if (uVar5 + uVar4 != 0) {
    data._32_8_ = &this->inlineCaches;
    count = (ulong)(uVar5 + uVar4);
    local_88 = (undefined1  [8])&void*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x188b;
    data.plusSize = count;
    pRVar8 = Memory::Recycler::TrackAllocInfo
                       (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                        recycler,(TrackAllocData *)local_88);
    ptr = Memory::AllocateArray<Memory::Recycler,void*,false>
                    ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocZero,0,count);
    local_88 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x188e;
    data.plusSize = count;
    pRVar8 = Memory::Recycler::TrackAllocInfo
                       (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                        recycler,(TrackAllocData *)local_88);
    puVar9 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                       ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeafZero,0,count);
    Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierSet(&this->m_inlineCacheTypes,puVar9);
    uVar5 = GetRootObjectLoadInlineCacheStart(this);
    uVar14 = (ulong)uVar5;
    for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
      pvVar10 = new<Memory::InlineCacheAllocator>
                          (0x20,&((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                 m_scriptContext)->inlineCacheAllocator,0x6dbe44);
      ptr[uVar13] = pvVar10;
    }
    this_01 = GetRootObject(this);
    this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
              threadContext;
    uVar5 = GetRootObjectLoadMethodInlineCacheStart(this);
    ppvVar15 = ptr + uVar14;
    for (; uVar14 < uVar5; uVar14 = uVar14 + 1) {
      PVar6 = GetPropertyIdFromCacheId(this,(uint)uVar14);
      pPVar11 = ThreadContext::GetPropertyName(this_00,PVar6);
      pIVar12 = RootObjectBase::GetInlineCache(this_01,pPVar11,false,false);
      *ppvVar15 = pIVar12;
      ppvVar15 = ppvVar15 + 1;
    }
    uVar5 = GetRootObjectStoreInlineCacheStart(this);
    for (; uVar14 < uVar5; uVar14 = uVar14 + 1) {
      PVar6 = GetPropertyIdFromCacheId(this,(uint)uVar14);
      pPVar11 = ThreadContext::GetPropertyName(this_00,PVar6);
      pIVar12 = RootObjectBase::GetInlineCache(this_01,pPVar11,true,false);
      *ppvVar15 = pIVar12;
      ppvVar15 = ppvVar15 + 1;
    }
    for (; uVar14 < uVar4; uVar14 = uVar14 + 1) {
      PVar6 = GetPropertyIdFromCacheId(this,(uint)uVar14);
      pPVar11 = ThreadContext::GetPropertyName(this_00,PVar6);
      pIVar12 = RootObjectBase::GetInlineCache(this_01,pPVar11,false,true);
      *ppvVar15 = pIVar12;
      ppvVar15 = ppvVar15 + 1;
    }
    for (; pSVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,
        uVar14 < count; uVar14 = uVar14 + 1) {
      pvVar10 = new<Memory::CacheAllocator>(0x20,&pSVar1->isInstInlineCacheAllocator,0x6dbcf8);
      *ppvVar15 = pvVar10;
      ppvVar15 = ppvVar15 + 1;
    }
    local_88 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x18b7;
    data.plusSize = count;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_88);
    puVar9 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                       ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeafZero,0,count);
    Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierSet(&this->m_inlineCacheTypes,puVar9);
    Memory::WriteBarrierPtr<void_*>::WriteBarrierSet((WriteBarrierPtr<void_*> *)data._32_8_,ptr);
  }
  return;
}

Assistant:

void FunctionBody::AllocateInlineCache()
    {
        Assert(this->inlineCaches == nullptr);
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + GetIsInstInlineCacheCount();

        if (totalCacheCount != 0)
        {
            // Root object inline cache are not leaf
            void ** inlineCaches = RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(),
                void*, totalCacheCount);
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(this->m_scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            __analysis_assume(plainInlineCacheEnd <= totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                inlineCaches[i] = AllocatorNewZ(InlineCacheAllocator,
                    this->m_scriptContext->GetInlineCacheAllocator(), InlineCache);
            }
            Js::RootObjectBase * rootObject = this->GetRootObject();
            ThreadContext * threadContext = this->GetScriptContext()->GetThreadContext();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            __analysis_assume(rootObjectLoadInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), false, false);
            }
            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            __analysis_assume(rootObjectLoadMethodInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), true, false);
            }
            uint rootObjectStoreInlineCacheEnd = isInstInlineCacheStart;
            __analysis_assume(rootObjectStoreInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
#pragma prefast(suppress:6386, "The analysis assume didn't help prefast figure out this is in range")
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), false, true);
            }
            for (; i < totalCacheCount; i++)
            {
                inlineCaches[i] = AllocatorNewStructZ(CacheAllocator,
                    this->m_scriptContext->GetIsInstInlineCacheAllocator(), IsInstInlineCache);
            }
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(this->m_scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            this->inlineCaches = inlineCaches;
        }
    }